

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_aggregate.cpp
# Opt level: O1

void duckdb::RowOperations::FinalizeStates
               (RowOperationsState *state,TupleDataLayout *layout,Vector *addresses,
               DataChunk *result,idx_t aggr_idx)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr_00;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> _Var1;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_00;
  type target;
  reference pvVar2;
  reference pvVar3;
  FunctionDataWrapper *pFVar4;
  size_type __n;
  pointer *__ptr;
  AggregateInputData aggr_input_data;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> local_68;
  AggregateInputData local_60;
  Aggregates *local_48;
  RowOperationsState *local_40;
  idx_t local_38;
  
  this = &state->addresses;
  local_40 = state;
  local_38 = aggr_idx;
  if ((state->addresses).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t
      .super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    this_00._M_head_impl = (Vector *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_60,POINTER);
    Vector::Vector(this_00._M_head_impl,(LogicalType *)&local_60,0x800);
    local_68.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)
         (_Head_base<0UL,_duckdb::Vector_*,_false>)this_00._M_head_impl;
    LogicalType::~LogicalType((LogicalType *)&local_60);
    _Var1.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         local_68.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    local_68.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)(Vector *)0x0;
    __ptr_00.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (this->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>;
    (this->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false> =
         _Var1.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)this,
                 (Vector *)__ptr_00.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
    if (local_68.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_68,
                 (Vector *)local_68.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
  }
  target = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
  VectorOperations::Copy(addresses,target,result->count,0,0);
  VectorOperations::AddInPlace(target,layout->data_width + layout->flag_width,result->count);
  if ((layout->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (layout->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_48 = &layout->aggregates;
    __n = 0;
    do {
      pvVar2 = vector<duckdb::Vector,_true>::operator[](&result->data,local_38 + __n);
      pvVar3 = vector<duckdb::AggregateObject,_true>::operator[](local_48,__n);
      if ((pvVar3->bind_data_wrapper).internal.
          super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        local_60.bind_data.ptr = (FunctionData *)0x0;
      }
      else {
        pFVar4 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                           (&pvVar3->bind_data_wrapper);
        local_60.bind_data.ptr =
             (pFVar4->function_data).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      }
      local_60.allocator = local_40->allocator;
      local_60.combine_type = PRESERVE_INPUT;
      (*(pvVar3->function).finalize)(target,&local_60,pvVar2,result->count,0);
      VectorOperations::AddInPlace(target,pvVar3->payload_size,result->count);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(layout->aggregates).
                                  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                  .
                                  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(layout->aggregates).
                                  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                  .
                                  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) *
                          0x2e8ba2e8ba2e8ba3));
  }
  return;
}

Assistant:

void RowOperations::FinalizeStates(RowOperationsState &state, TupleDataLayout &layout, Vector &addresses,
                                   DataChunk &result, idx_t aggr_idx) {
	// Copy the addresses
	if (!state.addresses) {
		state.addresses = make_uniq<Vector>(LogicalType::POINTER);
	}
	auto &addresses_copy = *state.addresses;
	VectorOperations::Copy(addresses, addresses_copy, result.size(), 0, 0);

	//	Move to the first aggregate state
	VectorOperations::AddInPlace(addresses_copy, UnsafeNumericCast<int64_t>(layout.GetAggrOffset()), result.size());

	auto &aggregates = layout.GetAggregates();
	for (idx_t i = 0; i < aggregates.size(); i++) {
		auto &target = result.data[aggr_idx + i];
		auto &aggr = aggregates[i];
		AggregateInputData aggr_input_data(aggr.GetFunctionData(), state.allocator);
		aggr.function.finalize(addresses_copy, aggr_input_data, target, result.size(), 0);

		// Move to the next aggregate state
		VectorOperations::AddInPlace(addresses_copy, UnsafeNumericCast<int64_t>(aggr.payload_size), result.size());
	}
}